

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlaceTiles.cpp
# Opt level: O1

void __thiscall commands::PlaceTiles::undo(PlaceTiles *this)

{
  long lVar1;
  size_t sVar2;
  Tile TStack_58;
  Tile local_40;
  
  sVar2 = this->lastExecuteSize_;
  if (sVar2 != 0) {
    lVar1 = sVar2 * 8;
    do {
      sVar2 = sVar2 - 1;
      TilePool::accessTile
                (&local_40,this->pool_,
                 (this->poolSectors_).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[sVar2 >> 4],(uint)sVar2 & 0xf);
      Board::accessTile(&TStack_58,this->board_,
                        (Vector2i *)
                        ((long)&(this->tilePositions_).
                                super__Vector_base<sf::Vector2<int>,_std::allocator<sf::Vector2<int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].x + lVar1));
      Tile::swapWith(&local_40,&TStack_58);
      lVar1 = lVar1 + -8;
    } while (sVar2 != 0);
  }
  this->lastExecuteSize_ = 0;
  return;
}

Assistant:

void PlaceTiles::undo() {
    for (size_t i = lastExecuteSize_; i > 0; --i) {
        accessTile(i - 1).swapWith(board_.accessTile(tilePositions_[i - 1]));
    }
    lastExecuteSize_ = 0;
}